

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  sqlite3_stmt *a_00;
  int iVar1;
  int iVar2;
  char *zBuf;
  int local_60;
  u32 x;
  int nStat;
  int rc;
  int i;
  sqlite3_stmt *pStmt;
  u32 *a;
  sqlite3_stmt *psStack_38;
  int nBlob;
  char *pBlob;
  u32 *puStack_28;
  int nChng_local;
  u32 *aSzDel_local;
  u32 *aSzIns_local;
  Fts3Table *p_local;
  int *pRC_local;
  
  iVar1 = p->nColumn + 2;
  if (*pRC == 0) {
    pBlob._4_4_ = nChng;
    puStack_28 = aSzDel;
    aSzDel_local = aSzIns;
    aSzIns_local = (u32 *)p;
    p_local = (Fts3Table *)pRC;
    pStmt = (sqlite3_stmt *)sqlite3_malloc64((long)iVar1 * 0xe);
    if (pStmt == (sqlite3_stmt *)0x0) {
      *(undefined4 *)&(p_local->base).pModule = 7;
    }
    else {
      psStack_38 = pStmt + (long)iVar1 * 4;
      iVar2 = fts3SqlStmt((Fts3Table *)aSzIns_local,0x16,(sqlite3_stmt **)&rc,(sqlite3_value **)0x0)
      ;
      if (iVar2 == 0) {
        sqlite3_bind_int(_rc,1,0);
        iVar2 = sqlite3_step(_rc);
        a_00 = pStmt;
        if (iVar2 == 100) {
          zBuf = (char *)sqlite3_column_blob(_rc,0);
          iVar2 = sqlite3_column_bytes(_rc,0);
          fts3DecodeIntArray(iVar1,(u32 *)a_00,zBuf,iVar2);
        }
        else {
          memset(pStmt,0,(long)iVar1 << 2);
        }
        iVar2 = sqlite3_reset(_rc);
        if (iVar2 == 0) {
          if ((pBlob._4_4_ < 0) && (*(uint *)pStmt < (uint)-pBlob._4_4_)) {
            *(undefined4 *)pStmt = 0;
          }
          else {
            *(int *)pStmt = pBlob._4_4_ + *(int *)pStmt;
          }
          for (nStat = 0; nStat < (int)(aSzIns_local[0xc] + 1); nStat = nStat + 1) {
            if (*(int *)(pStmt + (long)(nStat + 1) * 4) + aSzDel_local[nStat] < puStack_28[nStat]) {
              local_60 = 0;
            }
            else {
              local_60 = (*(int *)(pStmt + (long)(nStat + 1) * 4) + aSzDel_local[nStat]) -
                         puStack_28[nStat];
            }
            *(int *)(pStmt + (long)(nStat + 1) * 4) = local_60;
          }
          fts3EncodeIntArray(iVar1,(u32 *)pStmt,(char *)psStack_38,(int *)((long)&a + 4));
          iVar1 = fts3SqlStmt((Fts3Table *)aSzIns_local,0x17,(sqlite3_stmt **)&rc,
                              (sqlite3_value **)0x0);
          if (iVar1 == 0) {
            sqlite3_bind_int(_rc,1,0);
            sqlite3_bind_blob(_rc,2,psStack_38,a._4_4_,(_func_void_void_ptr *)0x0);
            sqlite3_step(_rc);
            iVar1 = sqlite3_reset(_rc);
            *(int *)&(p_local->base).pModule = iVar1;
            sqlite3_bind_null(_rc,2);
            sqlite3_free(pStmt);
          }
          else {
            sqlite3_free(pStmt);
            *(int *)&(p_local->base).pModule = iVar1;
          }
        }
        else {
          sqlite3_free(pStmt);
          *(int *)&(p_local->base).pModule = iVar2;
        }
      }
      else {
        sqlite3_free(pStmt);
        *(int *)&(p_local->base).pModule = iVar2;
      }
    }
  }
  return;
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}